

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

int ON__ClassIdDumpNode_CompareUuid(ON__ClassIdDumpNode *a,ON__ClassIdDumpNode *b)

{
  undefined4 local_1c;
  int rc;
  ON__ClassIdDumpNode *b_local;
  ON__ClassIdDumpNode *a_local;
  
  if (a == (ON__ClassIdDumpNode *)0x0) {
    local_1c = -1;
    if (b == (ON__ClassIdDumpNode *)0x0) {
      local_1c = 0;
    }
  }
  else if (b == (ON__ClassIdDumpNode *)0x0) {
    local_1c = 1;
  }
  else {
    local_1c = ON__ClassIdDumpNode::CompareClassUuid(a,b);
  }
  return local_1c;
}

Assistant:

static int ON__ClassIdDumpNode_CompareUuid( const ON__ClassIdDumpNode* a, const ON__ClassIdDumpNode* b )
{
  int rc = 0;
  if ( 0 == a )
  {
    rc = (0 == b) ? 0 : -1;
  }
  else if ( 0 == b )
  {
    rc = 1;
  }
  else
  {
    rc = a->CompareClassUuid(*b);
  }
  return rc;
}